

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

SQInteger __thiscall SQFuncState::GetOuterVariable(SQFuncState *this,SQObject *name)

{
  SQObject *name_00;
  SQOuterVar *pSVar1;
  SQUnsignedInteger SVar2;
  SQFuncState *in_RSI;
  SQOuterVar *in_RDI;
  SQInteger pos;
  SQInteger i;
  SQInteger outers;
  SQOuterVar *in_stack_ffffffffffffff20;
  SQFuncState *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  SQObjectPtr *in_stack_ffffffffffffff40;
  SQObjectValue in_stack_ffffffffffffff48;
  SQOuterVar *in_stack_ffffffffffffff50;
  SQObjectPtr local_78;
  SQObjectPtr local_68 [3];
  SQInteger local_30;
  SQUnsignedInteger local_28;
  
  name_00 = (SQObject *)sqvector<SQOuterVar>::size((sqvector<SQOuterVar> *)&in_RDI[4]._name);
  for (local_28 = 0; (long)local_28 < (long)name_00; local_28 = local_28 + 1) {
    pSVar1 = sqvector<SQOuterVar>::operator[]((sqvector<SQOuterVar> *)&in_RDI[4]._name,local_28);
    if ((pSVar1->_name).super_SQObject._unVal.pTable == (SQTable *)(in_RSI->_vlocals)._vals) {
      return local_28;
    }
  }
  local_30 = 0xffffffffffffffff;
  if (in_RDI[8]._name.super_SQObject._unVal.pTable != (SQTable *)0x0) {
    local_30 = GetLocalVariable((SQFuncState *)
                                CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                (SQObject *)in_stack_ffffffffffffff30);
    if (local_30 != -1) {
      MarkLocalAsOuter(in_stack_ffffffffffffff30,(SQInteger)in_RDI);
      ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffff40,(SQObject *)in_RSI);
      ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffff30,local_30);
      SQOuterVar::SQOuterVar
                (in_stack_ffffffffffffff50,(SQObjectPtr *)in_stack_ffffffffffffff48.pTable,
                 in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      sqvector<SQOuterVar>::push_back((sqvector<SQOuterVar> *)in_stack_ffffffffffffff30,in_RDI);
      SQOuterVar::~SQOuterVar(in_stack_ffffffffffffff20);
      ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff20);
      ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff20);
      SVar2 = sqvector<SQOuterVar>::size((sqvector<SQOuterVar> *)&in_RDI[4]._name);
      return SVar2 - 1;
    }
    local_30 = GetOuterVariable(in_RSI,name_00);
    if (local_30 != -1) {
      pSVar1 = (SQOuterVar *)&in_RDI[4]._name;
      ::SQObjectPtr::SQObjectPtr(local_68,(SQObject *)in_RSI);
      ::SQObjectPtr::SQObjectPtr(&local_78,local_30);
      SQOuterVar::SQOuterVar
                (in_stack_ffffffffffffff50,(SQObjectPtr *)in_stack_ffffffffffffff48.pTable,
                 in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      sqvector<SQOuterVar>::push_back((sqvector<SQOuterVar> *)in_stack_ffffffffffffff30,in_RDI);
      SQOuterVar::~SQOuterVar(pSVar1);
      ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)pSVar1);
      ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)pSVar1);
      SVar2 = sqvector<SQOuterVar>::size((sqvector<SQOuterVar> *)&in_RDI[4]._name);
      return SVar2 - 1;
    }
  }
  return -1;
}

Assistant:

SQInteger SQFuncState::GetOuterVariable(const SQObject &name)
{
    SQInteger outers = _outervalues.size();
    for(SQInteger i = 0; i<outers; i++) {
        if(_string(_outervalues[i]._name) == _string(name))
            return i;
    }
    SQInteger pos=-1;
    if(_parent) {
        pos = _parent->GetLocalVariable(name);
        if(pos == -1) {
            pos = _parent->GetOuterVariable(name);
            if(pos != -1) {
                _outervalues.push_back(SQOuterVar(name,SQObjectPtr(SQInteger(pos)),otOUTER)); //local
                return _outervalues.size() - 1;
            }
        }
        else {
            _parent->MarkLocalAsOuter(pos);
            _outervalues.push_back(SQOuterVar(name,SQObjectPtr(SQInteger(pos)),otLOCAL)); //local
            return _outervalues.size() - 1;


        }
    }
    return -1;
}